

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLineArguments.cpp
# Opt level: O0

void __thiscall
CommandLineArguments::setPackageName(CommandLineArguments *this,int ac,char **av,int *i)

{
  size_t sVar1;
  SimpleString local_48;
  undefined1 local_38 [8];
  SimpleString packageName;
  int *i_local;
  char **av_local;
  int ac_local;
  CommandLineArguments *this_local;
  
  packageName.bufferSize_ = (size_t)i;
  SimpleString::SimpleString(&local_48,"-k");
  getParameterField((CommandLineArguments *)local_38,(int)this,(char **)(ulong)(uint)ac,(int *)av,
                    (SimpleString *)i);
  SimpleString::~SimpleString(&local_48);
  sVar1 = SimpleString::size((SimpleString *)local_38);
  if (sVar1 != 0) {
    SimpleString::operator=(&this->packageName_,(SimpleString *)local_38);
  }
  SimpleString::~SimpleString((SimpleString *)local_38);
  return;
}

Assistant:

void CommandLineArguments::setPackageName(int ac, const char *const *av, int& i)
{
    SimpleString packageName = getParameterField(ac, av, i, "-k");
    if (packageName.size() == 0) return;

    packageName_ = packageName;
}